

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::AdvancedSwitchProgramsCS::Run(AdvancedSwitchProgramsCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  ostream *poVar3;
  uint *puVar4;
  int i;
  long lVar5;
  long lVar6;
  GLubyte data1 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  GLubyte data [16];
  GLubyte data3 [16];
  GLubyte data2 [16];
  GLubyte data0 [16];
  undefined1 local_1a8 [376];
  
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  lVar6 = 10;
  do {
    lVar5 = lVar6;
    if (lVar5 == 0xe) goto LAB_00974a82;
    std::__cxx11::stringstream::stringstream((stringstream *)data0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"\nlayout(local_size_x = 1) in;\nlayout(binding = ",0x2f);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)lVar5 + -9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,
               ", std430) buffer Input {\n  uint cookie[4];\n} g_in;\nlayout(binding = 0, std430) buffer Output {\n  uvec4 digest;\n} ;\nvoid main() {\n  switch (g_in.cookie[0]+g_in.cookie[1]+g_in.cookie[2]+g_in.cookie[3]) {\n    case 0x000000ffu: digest.x = 0xff000000u; break;\n    case 0x0000ff00u: digest.y = 0x00ff0000u; break;\n    case 0x00ff0000u: digest.z = 0x0000ff00u; break;\n    case 0xff000000u: digest.w = 0x000000ffu; break;\n  }\n}"
               ,0x1a3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)data0);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,(string *)data1);
    this->m_program[lVar5 + -10] = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)data1._0_8_ != &local_1f8) {
      operator_delete((void *)data1._0_8_,local_1f8._M_allocated_capacity + 1);
    }
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program[lVar5 + -10]);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program[lVar5 + -10]);
    lVar6 = lVar5 + 1;
  } while (bVar1);
  lVar6 = -1;
  if (3 < lVar5 - 10U) {
LAB_00974a82:
    glu::CallLogWrapper::glGenBuffers(this_00,5,this->m_storage_buffer);
    data0[0] = '\0';
    data0[1] = '\0';
    data0[2] = '\0';
    data0[3] = '\x11';
    data0[4] = '\0';
    data0[5] = '\0';
    data0[6] = '\0';
    data0[7] = 'D';
    data0[8] = '\0';
    data0[9] = '\0';
    data0[10] = '\0';
    data0[0xb] = 0x88;
    data0[0xc] = '\0';
    data0[0xd] = '\0';
    data0[0xe] = '\0';
    data0[0xf] = '\"';
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data0,0x88e4);
    data1[0] = '\0';
    data1[1] = '\0';
    data1[2] = 'D';
    data1[3] = '\0';
    data1[4] = '\0';
    data1[5] = '\0';
    data1[6] = '\"';
    data1[7] = '\0';
    data1[8] = '\0';
    data1[9] = '\0';
    data1[10] = 0x88;
    data1[0xb] = '\0';
    data1[0xc] = '\0';
    data1[0xd] = '\0';
    data1[0xe] = '\x11';
    data1[0xf] = '\0';
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data1,0x88e4);
    data2[0] = '\0';
    data2[1] = 0x88;
    data2[2] = '\0';
    data2[3] = '\0';
    data2[4] = '\0';
    data2[5] = '\x11';
    data2[6] = '\0';
    data2[7] = '\0';
    data2[8] = '\0';
    data2[9] = 'D';
    data2[10] = '\0';
    data2[0xb] = '\0';
    data2[0xc] = '\0';
    data2[0xd] = '\"';
    data2[0xe] = '\0';
    data2[0xf] = '\0';
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data2,0x88e4);
    data3[0] = '\"';
    data3[1] = '\0';
    data3[2] = '\0';
    data3[3] = '\0';
    data3[4] = 0x88;
    data3[5] = '\0';
    data3[6] = '\0';
    data3[7] = '\0';
    data3[8] = '\x11';
    data3[9] = '\0';
    data3[10] = '\0';
    data3[0xb] = '\0';
    data3[0xc] = 'D';
    data3[0xd] = '\0';
    data3[0xe] = '\0';
    data3[0xf] = '\0';
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data3,0x88e4);
    data[0] = '\0';
    data[1] = '\0';
    data[2] = '\0';
    data[3] = '\0';
    data[4] = '\0';
    data[5] = '\0';
    data[6] = '\0';
    data[7] = '\0';
    data[8] = '\0';
    data[9] = '\0';
    data[10] = '\0';
    data[0xb] = '\0';
    data[0xc] = '\0';
    data[0xd] = '\0';
    data[0xe] = '\0';
    data[0xf] = '\0';
    lVar6 = 0;
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,data,0x88e4);
    do {
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program[lVar6]);
      glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[0]);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
    lVar6 = -1;
    if (puVar4 != (uint *)0x0) {
      if ((((*puVar4 == 0xff000000) && (puVar4[1] == 0xff0000)) && (puVar4[2] == 0xff00)) &&
         (puVar4[3] == 0xff)) {
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        lVar6 = 0;
      }
      else {
        anon_unknown_0::Output
                  ("Received: %x, %x, %x, %x, but expected: %x, %x, %x, %x\n",(ulong)*puVar4,
                   (ulong)puVar4[1],(ulong)puVar4[2],(ulong)puVar4[3],0xff000000,0xff0000,0xff00,
                   0xff);
      }
    }
  }
  return lVar6;
}

Assistant:

virtual long Run()
	{
		for (int i = 0; i < 4; ++i)
		{
			m_program[i] = CreateProgramCS(GenSource(i + 1));
			glLinkProgram(m_program[i]);
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glGenBuffers(5, m_storage_buffer);

		const GLubyte data0[] = { 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0, 0x88, 0, 0, 0, 0x22 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data0), data0, GL_STATIC_DRAW);
		const GLubyte data1[] = { 0, 0, 0x44, 0, 0, 0, 0x22, 0, 0, 0, 0x88, 0, 0, 0, 0x11, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data1), data1, GL_STATIC_DRAW);
		const GLubyte data2[] = { 0, 0x88, 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0, 0x22, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data2), data2, GL_STATIC_DRAW);
		const GLubyte data3[] = { 0x22, 0, 0, 0, 0x88, 0, 0, 0, 0x11, 0, 0, 0, 0x44, 0, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data3), data3, GL_STATIC_DRAW);

		const GLubyte data[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_STATIC_DRAW);

		for (int i = 0; i < 4; ++i)
		{
			glUseProgram(m_program[i]);
			glDispatchCompute(1, 1, 1);
		}
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[0]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLuint* out_data = (GLuint*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data0), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		GLuint expected[4] = { 0xff000000, 0x00ff0000, 0x0000ff00, 0x000000ff };
		if (out_data[0] != expected[0] || out_data[1] != expected[1] || out_data[2] != expected[2] ||
			out_data[3] != expected[3])
		{
			Output("Received: %x, %x, %x, %x, but expected: %x, %x, %x, %x\n", out_data[0], out_data[1], out_data[2],
				   out_data[3], expected[0], expected[1], expected[2], expected[3]);
			return ERROR;
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		return NO_ERROR;
	}